

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocanalysis.cpp
# Opt level: O1

TPZCompEl * TPZPostProcAnalysis::CreateCubeEl(TPZGeoEl *gel,TPZCompMesh *mesh)

{
  TPZCompElH1<pzshape::TPZShapeCube> *this;
  
  if ((gel->fReference == (TPZCompEl *)0x0) && (gel->fNumInterfaces == 0)) {
    this = (TPZCompElH1<pzshape::TPZShapeCube> *)operator_new(0x168);
    *(undefined ***)
     &(this->super_TPZIntelGen<pzshape::TPZShapeCube>).super_TPZInterpolatedElement.
      super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_019a0990;
    TPZCompElH1<pzshape::TPZShapeCube>::TPZCompElH1(this,&PTR_PTR_01999640,mesh,gel,EH1Standard);
    *(undefined8 *)
     &this[1].super_TPZIntelGen<pzshape::TPZShapeCube>.super_TPZInterpolatedElement.
      super_TPZInterpolationSpace.super_TPZCompEl = 0;
    *(undefined ***)
     &(this->super_TPZIntelGen<pzshape::TPZShapeCube>).super_TPZInterpolatedElement.
      super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElPostProc_01999270;
  }
  else {
    this = (TPZCompElH1<pzshape::TPZShapeCube> *)0x0;
  }
  return (TPZCompEl *)this;
}

Assistant:

TPZCompEl *TPZPostProcAnalysis::CreateCubeEl(TPZGeoEl *gel,TPZCompMesh &mesh) {
	if(!gel->Reference() && gel->NumInterfaces() == 0)
		return new TPZCompElPostProc<TPZCompElH1<TPZShapeCube> >(mesh,gel);
	return NULL;
}